

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  element_type *peVar4;
  long *plVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 *puVar8;
  size_t sVar9;
  size_t sVar10;
  runtime_error *this_00;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  ptr<resp_msg> pVar12;
  ptr<snapshot_sync_req> sync_req;
  long *local_130 [2];
  long local_120 [2];
  undefined1 local_110 [16];
  _Head_base<0UL,_cornerstone::buffer_*,_false> *local_100 [2];
  _Head_base<0UL,_cornerstone::buffer_*,_false> local_f0 [11];
  char *local_98;
  char *local_38;
  
  if ((*(element_type **)(in_RDX + 8) ==
       ((req[3].log_entries_.
         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) &&
     (*(char *)((long)&req->last_log_idx_ + 2) == '\0')) {
    iVar1 = *(int *)&req[3].log_entries_.
                     super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    if (iVar1 == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (iVar1 == 3) {
        plVar5 = (long *)req[4].last_log_term_;
        local_38 = 
        "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
        ;
        snprintf((char *)local_100,200,
                 "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
                 ,(ulong)*(uint *)(in_RDX + 0x14));
        local_130[0] = local_120;
        sVar10 = strlen((char *)local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_130,local_100,(long)local_100 + sVar10);
        (**(code **)(*plVar5 + 0x28))(plVar5,local_130);
        std::__cxx11::string::~string((string *)local_130);
        peVar4 = (((req->log_entries_).
                   super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(code **)(peVar4->term_ + 0x40))(peVar4,0xffffffff);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  peVar4 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  puVar8 = (undefined8 *)operator_new(0x40);
  puVar8[1] = 0x100000001;
  *puVar8 = &PTR___Sp_counted_ptr_inplace_0017a728;
  uVar3 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar8[3] = peVar4;
  *(undefined4 *)(puVar8 + 4) = 0x11;
  *(undefined4 *)((long)puVar8 + 0x24) = uVar3;
  *(undefined4 *)(puVar8 + 5) = uVar2;
  puVar8[2] = &PTR__msg_base_0017a778;
  puVar8[6] = 0;
  *(undefined1 *)(puVar8 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar8;
  this->_vptr_raft_server = (_func_int **)(puVar8 + 2);
  if ((*(char *)((long)&req->last_log_idx_ + 2) == '\0') &&
     (*(element_type **)(in_RDX + 8) <
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)) {
    plVar5 = (long *)req[4].last_log_term_;
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,
               "received an install snapshot request which has lower term than this server, decline the request"
               ,"");
    (**(code **)(*plVar5 + 0x18))(plVar5,local_100);
    _Var11._M_pi = extraout_RDX;
  }
  else {
    plVar5 = *(long **)(in_RDX + 0x38);
    if ((*(long *)(in_RDX + 0x40) - (long)plVar5 == 0x10) && (*(int *)(*plVar5 + 8) == 5)) {
      if (*(buffer **)(*plVar5 + 0x18) == (buffer *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"get_buf cannot be called for a log_entry with nil buffer");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      snapshot_sync_req::deserialize((snapshot_sync_req *)local_110,*(buffer **)(*plVar5 + 0x18));
      if (req->last_log_term_ <
          ((((ptr<snapshot> *)local_110._0_8_)->
           super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          last_log_idx_) {
        bVar7 = handle_snapshot_sync_req((raft_server *)req,(snapshot_sync_req *)local_110._0_8_);
        _Var11._M_pi = extraout_RDX_00;
        if (bVar7) {
          uVar6 = *(ulong *)(local_110._0_8_ + 0x10);
          sVar9 = buffer::size((((bufptr *)(local_110._0_8_ + 0x18))->_M_t).
                               super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>
                               ._M_t.
                               super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>
                               .super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
          puVar8[6] = sVar9 + uVar6;
          *(undefined1 *)(puVar8 + 7) = 1;
          _Var11._M_pi = extraout_RDX_01;
        }
      }
      else {
        plVar5 = (long *)req[4].last_log_term_;
        local_98 = "received a snapshot (%llu) that is older than current log store";
        snprintf((char *)local_100,100,
                 "received a snapshot (%llu) that is older than current log store",
                 ((((ptr<snapshot> *)local_110._0_8_)->
                  super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 last_log_idx_);
        local_130[0] = local_120;
        sVar10 = strlen((char *)local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_130,local_100,(long)local_100 + sVar10);
        (**(code **)(*plVar5 + 0x20))(plVar5,local_130);
        _Var11._M_pi = extraout_RDX_04;
        if (local_130[0] != local_120) {
          operator_delete(local_130[0],local_120[0] + 1);
          _Var11._M_pi = extraout_RDX_05;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        _Var11._M_pi = extraout_RDX_06;
      }
      goto LAB_0014f840;
    }
    plVar5 = (long *)req[4].last_log_term_;
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,
               "Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value"
               ,"");
    (**(code **)(*plVar5 + 0x20))(plVar5,local_100);
    _Var11._M_pi = extraout_RDX_02;
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],(ulong)(local_f0[0]._M_head_impl + 1));
    _Var11._M_pi = extraout_RDX_03;
  }
LAB_0014f840:
  pVar12.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar12.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar12.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req)
{
    if (req.get_term() == state_->get_term() && !catching_up_)
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->err(lstrfmt("Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a "
                            "bug, server exits")
                        .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            return ptr<resp_msg>();
        }
        else
        {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::install_snapshot_response, id_, req.get_src()));
    if (!catching_up_ && req.get_term() < state_->get_term())
    {
        l_->info("received an install snapshot request which has lower term than this server, decline the request");
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::snp_sync_req)
    {
        l_->warn("Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req(snapshot_sync_req::deserialize(entries[0]->get_buf()));
    if (sync_req->get_snapshot().get_last_log_idx() <= sm_commit_index_)
    {
        l_->warn(sstrfmt("received a snapshot (%llu) that is older than current log store")
                     .fmt(sync_req->get_snapshot().get_last_log_idx()));
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req))
    {
        resp->accept(sync_req->get_offset() + sync_req->get_data().size());
    }

    return resp;
}